

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Select * sqlite3SelectDup(sqlite3 *db,Select *pDup,int flags)

{
  bool bVar1;
  anon_union_8_18_67db040d_for_u p;
  ExprList *pEVar2;
  SrcList *pSVar3;
  Expr *pEVar4;
  With *pWVar5;
  Window *pWVar6;
  Window *p_00;
  Window **ppWVar7;
  long in_FS_OFFSET;
  Select *pRet;
  anon_union_8_18_67db040d_for_u *local_80;
  anon_union_8_18_67db040d_for_u local_78;
  anon_union_8_18_67db040d_for_u local_70;
  undefined1 local_68 [40];
  anon_union_8_18_67db040d_for_u aStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.pNC = (NameContext *)0x0;
  if (pDup != (Select *)0x0) {
    local_80 = &local_70;
    local_78.pNC = (NameContext *)0x0;
    do {
      p.pNC = (NameContext *)sqlite3DbMallocRawNN(db,0x80);
      if ((Select *)p.pNC == (Select *)0x0) {
LAB_0017ee78:
        bVar1 = false;
      }
      else {
        pEVar2 = sqlite3ExprListDup(db,pDup->pEList,flags);
        (p.pSelect)->pEList = pEVar2;
        pSVar3 = sqlite3SrcListDup(db,pDup->pSrc,flags);
        (p.pSelect)->pSrc = pSVar3;
        if (pDup->pWhere == (Expr *)0x0) {
          pEVar4 = (Expr *)0x0;
        }
        else {
          pEVar4 = exprDup(db,pDup->pWhere,flags,(EdupBuf *)0x0);
        }
        (p.pSelect)->pWhere = pEVar4;
        pEVar2 = sqlite3ExprListDup(db,pDup->pGroupBy,flags);
        (p.pSelect)->pGroupBy = pEVar2;
        if (pDup->pHaving == (Expr *)0x0) {
          pEVar4 = (Expr *)0x0;
        }
        else {
          pEVar4 = exprDup(db,pDup->pHaving,flags,(EdupBuf *)0x0);
        }
        (p.pSelect)->pHaving = pEVar4;
        pEVar2 = sqlite3ExprListDup(db,pDup->pOrderBy,flags);
        (p.pSelect)->pOrderBy = pEVar2;
        *p.pCCurHint = (CCurHint)pDup->op;
        (p.pSelect)->pNext = (Select *)local_78;
        (p.pSelect)->pPrior = (Select *)0x0;
        if (pDup->pLimit == (Expr *)0x0) {
          pEVar4 = (Expr *)0x0;
        }
        else {
          pEVar4 = exprDup(db,pDup->pLimit,flags,(EdupBuf *)0x0);
        }
        (p.pSelect)->pLimit = pEVar4;
        (p.pNC)->pSrcList = (SrcList *)0x0;
        (p.pSrcList)->nAlloc = pDup->selFlags & 0xffffffdf;
        ((int *)((long)&(p.pRefSrcList)->nExclude + 4))[0] = -1;
        ((int *)((long)&(p.pRefSrcList)->nExclude + 4))[1] = -1;
        (p.pSelect)->nSelectRow = pDup->nSelectRow;
        pWVar5 = sqlite3WithDup(db,pDup->pWith);
        (p.pSelect)->pWith = pWVar5;
        (p.pSelect)->pWin = (Window *)0x0;
        p_00 = pDup->pWinDefn;
        local_68._0_8_ = (Parse *)0x0;
        if (p_00 != (Window *)0x0) {
          ppWVar7 = (Window **)local_68;
          do {
            pWVar6 = sqlite3WindowDup(db,(Expr *)0x0,p_00);
            *ppWVar7 = pWVar6;
            if (pWVar6 == (Window *)0x0) break;
            ppWVar7 = &pWVar6->pNextWin;
            p_00 = p_00->pNextWin;
          } while (p_00 != (Window *)0x0);
        }
        (p.pSelect)->pWinDefn = (Window *)local_68._0_8_;
        if ((pDup->pWin != (Window *)0x0) && (db->mallocFailed == '\0')) {
          local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_68._8_8_ = gatherSelectWindowsCallback;
          local_68._16_8_ = gatherSelectWindowsSelectCallback;
          local_68._24_8_ = (_func_void_Walker_ptr_Select_ptr *)0x0;
          local_68._0_8_ = (Parse *)0x0;
          aStack_40.pNC = p.pNC;
          sqlite3WalkSelect((Walker *)local_68,p.pSelect);
        }
        (p.pSelect)->selId = pDup->selId;
        if (db->mallocFailed != '\0') {
          (p.pSelect)->pNext = (Select *)0x0;
          clearSelect(db,p.pSelect,1);
          goto LAB_0017ee78;
        }
        local_80->pSelect = (Select *)p;
        local_80 = (anon_union_8_18_67db040d_for_u *)&(p.pSelect)->pPrior;
        bVar1 = true;
        local_78.pNC = p.pNC;
      }
    } while ((bVar1) && (pDup = pDup->pPrior, pDup != (Select *)0x0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Select *)local_70.pNC;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectDup(sqlite3 *db, const Select *pDup, int flags){
  Select *pRet = 0;
  Select *pNext = 0;
  Select **pp = &pRet;
  const Select *p;

  assert( db!=0 );
  for(p=pDup; p; p=p->pPrior){
    Select *pNew = sqlite3DbMallocRawNN(db, sizeof(*p) );
    if( pNew==0 ) break;
    pNew->pEList = sqlite3ExprListDup(db, p->pEList, flags);
    pNew->pSrc = sqlite3SrcListDup(db, p->pSrc, flags);
    pNew->pWhere = sqlite3ExprDup(db, p->pWhere, flags);
    pNew->pGroupBy = sqlite3ExprListDup(db, p->pGroupBy, flags);
    pNew->pHaving = sqlite3ExprDup(db, p->pHaving, flags);
    pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, flags);
    pNew->op = p->op;
    pNew->pNext = pNext;
    pNew->pPrior = 0;
    pNew->pLimit = sqlite3ExprDup(db, p->pLimit, flags);
    pNew->iLimit = 0;
    pNew->iOffset = 0;
    pNew->selFlags = p->selFlags & ~SF_UsesEphemeral;
    pNew->addrOpenEphm[0] = -1;
    pNew->addrOpenEphm[1] = -1;
    pNew->nSelectRow = p->nSelectRow;
    pNew->pWith = sqlite3WithDup(db, p->pWith);
#ifndef SQLITE_OMIT_WINDOWFUNC
    pNew->pWin = 0;
    pNew->pWinDefn = sqlite3WindowListDup(db, p->pWinDefn);
    if( p->pWin && db->mallocFailed==0 ) gatherSelectWindows(pNew);
#endif
    pNew->selId = p->selId;
    if( db->mallocFailed ){
      /* Any prior OOM might have left the Select object incomplete.
      ** Delete the whole thing rather than allow an incomplete Select
      ** to be used by the code generator. */
      pNew->pNext = 0;
      sqlite3SelectDelete(db, pNew);
      break;
    }
    *pp = pNew;
    pp = &pNew->pPrior;
    pNext = pNew;
  }
  return pRet;
}